

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_rep(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  int32_t rep;
  GCstr *s2;
  GCstr *s1;
  GCstr *pGVar3;
  SBuf *pSVar4;
  
  s2 = lj_lib_checkstr(L,1);
  rep = lj_lib_checkint(L,2);
  s1 = lj_lib_optstr(L,3);
  uVar1 = (L->glref).ptr64;
  *(lua_State **)(uVar1 + 0xe0) = L;
  *(undefined8 *)(uVar1 + 200) = *(undefined8 *)(uVar1 + 0xd8);
  pGVar3 = s2;
  if (1 < rep && s1 != (GCstr *)0x0) {
    pGVar3 = lj_buf_cat2str(L,s1,s2);
    *(undefined8 *)(uVar1 + 200) = *(undefined8 *)(uVar1 + 0xd8);
    lj_buf_putstr((SBuf *)(uVar1 + 200),s2);
    rep = rep + -1;
  }
  pSVar4 = lj_buf_putstr_rep((SBuf *)(uVar1 + 200),pGVar3,rep);
  pTVar2 = L->top;
  pGVar3 = lj_str_new(L,pSVar4->b,(ulong)(uint)(*(int *)&pSVar4->w - (int)pSVar4->b));
  pTVar2[-1].u64 = (ulong)pGVar3 | 0xfffd800000000000;
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(string_rep)		LJLIB_REC(.)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t rep = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  SBuf *sb = lj_buf_tmp_(L);
  if (sep && rep > 1) {
    GCstr *s2 = lj_buf_cat2str(L, sep, s);
    lj_buf_reset(sb);
    lj_buf_putstr(sb, s);
    s = s2;
    rep--;
  }
  sb = lj_buf_putstr_rep(sb, s, rep);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}